

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O1

void __thiscall TestEval::Run(TestEval *this)

{
  bool bVar1;
  int t;
  long lVar2;
  double dVar3;
  double dVar4;
  
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)Tests::enableLogFiles,(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)Tests::enableTimeTrace);
  nullcInitDynamicModule();
  lVar2 = 0;
  dVar3 = myGetPreciseTime();
  do {
    if ((&Tests::testExecutor)[lVar2] == '\x01') {
      testsCount[lVar2] = testsCount[lVar2] + 1;
      bVar1 = Tests::RunCodeSimple
                        ("import std.dynamic;\r\n\r\nint a = 5;\r\n\r\nfor(int i = 0; i < 200; i++)\r\n\teval(\"a += 3 * \" + i.str() + \";\");\r\n\r\nreturn a;"
                         ,testTarget[lVar2],"59705","Dynamic code. eval() [skip_c]",false,"");
      if (bVar1) {
        testsPassed[lVar2] = testsPassed[lVar2] + 1;
      }
      dVar4 = myGetPreciseTime();
      printf("Eval test finished in %f\n",dVar4 - dVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)Tests::enableLogFiles,(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)Tests::enableTimeTrace);
  nullcInitDynamicModule();
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();

		const char	*testEval =
"import std.dynamic;\r\n\
\r\n\
int a = 5;\r\n\
\r\n\
for(int i = 0; i < 200; i++)\r\n\
	eval(\"a += 3 * \" + i.str() + \";\");\r\n\
\r\n\
return a;";
		double evalStart = myGetPreciseTime();
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;
			testsCount[t]++;
			if(Tests::RunCodeSimple(testEval, testTarget[t], "59705", "Dynamic code. eval() [skip_c]", false, ""))
				testsPassed[t]++;
			printf("Eval test finished in %f\n", myGetPreciseTime() - evalStart);
		}
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();
	}